

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

double __thiscall opengv::math::Sturm::computeLagrangianBound(Sturm *this)

{
  Scalar *pSVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  size_type sVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double bound;
  size_t i_2;
  double max2;
  size_t i_1;
  double max1;
  size_t j;
  size_t i;
  vector<double,_std::allocator<double>_> coefficients;
  value_type_conflict1 *in_stack_ffffffffffffff48;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffff50;
  double dVar7;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_ffffffffffffff78;
  ulong local_68;
  double local_60;
  vector<double,_std::allocator<double>_> *local_58;
  double local_50;
  vector<double,_std::allocator<double>_> *local_48;
  ulong local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x127d3de);
  std::vector<double,_std::allocator<double>_>::reserve(in_RDI,in_stack_ffffffffffffff78);
  for (local_38 = 0;
      local_38 <
      (long)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - 1U; local_38 = local_38 + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48,0x127d43d);
    dVar7 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48,0x127d468);
    auVar5._0_8_ = dVar7 / *pSVar1;
    auVar5._8_8_ = 0;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    auVar5 = vpand_avx(auVar5,auVar6);
    auVar6 = vcvtusi2sd_avx512f(auVar6,local_38 + 1);
    pow(auVar5._0_8_,1.0 / auVar6._0_8_);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
  }
  local_48 = (vector<double,_std::allocator<double>_> *)0x0;
  local_50 = -1.0;
  local_58 = (vector<double,_std::allocator<double>_> *)0x0;
  while( true ) {
    this_00 = local_58;
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(&local_20);
    if (pvVar2 <= this_00) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(size_type)local_58)
    ;
    if (local_50 < *pvVar3) {
      local_48 = local_58;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_20,(size_type)local_58);
      local_50 = *pvVar3;
    }
    local_58 = (vector<double,_std::allocator<double>_> *)
               ((long)&(local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(size_type)local_48);
  *pvVar3 = -1.0;
  local_60 = -1.0;
  local_68 = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_20);
    if (sVar4 <= local_68) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,local_68);
    if (local_60 < *pvVar3) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,local_68);
      local_60 = *pvVar3;
    }
    local_68 = local_68 + 1;
  }
  dVar7 = local_50 + local_60;
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return dVar7;
}

Assistant:

double
opengv::math::Sturm::computeLagrangianBound()
{
  std::vector<double> coefficients;
  coefficients.reserve(_dimension-1);

  for(size_t i=0; i < _dimension-1; i++)
    coefficients.push_back(pow(fabs(_C(0,i+1)/_C(0,0)),(1.0/(i+1))));

  size_t j = 0;
  double max1 = -1.0;
  for( size_t i = 0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max1 )
    {
      j = i;
      max1 = coefficients[i];
    }
  }

  coefficients[j] = -1.0;

  double max2 = -1.0;
  for( size_t i=0; i < coefficients.size(); i++ )
  {
    if( coefficients[i] > max2 )
      max2 = coefficients[i];
  }

  double bound = max1 + max2;
  return bound;
}